

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O1

PrgBody * Clasp::Asp::PrgBody::create(LogicProgram *prg,uint32 id,Rule *r,uint32 pos,bool addDeps)

{
  PrgBody *this;
  PrgBody *pPVar1;
  PrgNode PVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  
  lVar6 = (r->field_3).cond.size * 4;
  if ((r->bt).val_ == Normal) {
    this = (PrgBody *)operator_new(lVar6 + 0x18);
    PrgBody(this,id,prg,&(r->field_3).cond,pos,addDeps);
  }
  else {
    this = (PrgBody *)operator_new(lVar6 + 0x20);
    PrgBody(this,id,prg,&(r->field_3).agg,(r->bt).val_ == Sum,pos,addDeps);
    uVar4 = *(uint *)&this->field_0x8;
    uVar3 = uVar4 & 0x18000000;
    if (uVar3 == 0) {
      uVar5 = uVar4 & 0x1ffffff;
    }
    else {
      pPVar1 = this + 1;
      if (uVar3 == 0x8000000) {
        pPVar1 = *(PrgBody **)&pPVar1->super_PrgNode;
      }
      uVar5 = *(uint *)&pPVar1->super_PrgNode;
    }
    if ((int)uVar5 < 1) {
LAB_0014c5eb:
      Potassco::fail(-2,
                     "static PrgBody *Clasp::Asp::PrgBody::create(LogicProgram &, uint32, const Rule &, uint32, bool)"
                     ,0x2cf,"ret->bound() > 0 && ret->sumW() > ret->bound()","body not simplified",0
                    );
    }
    if (uVar3 == 0x8000000) {
      uVar5 = *(uint *)((long)this[1].super_PrgNode + 4);
    }
    else {
      uVar5 = uVar4 & 0x1ffffff;
    }
    if (uVar3 == 0) {
      uVar4 = uVar4 & 0x1ffffff;
    }
    else {
      pPVar1 = this + 1;
      if (uVar3 == 0x8000000) {
        pPVar1 = *(PrgBody **)&pPVar1->super_PrgNode;
      }
      uVar4 = *(uint *)&pPVar1->super_PrgNode;
    }
    if ((int)uVar5 <= (int)uVar4) goto LAB_0014c5eb;
  }
  uVar4 = *(uint *)&this->field_0x8 & 0x18000000;
  if (uVar4 == 0x8000000) {
    PVar2 = this[1].super_PrgNode;
  }
  else {
    if (uVar4 == 0) {
      uVar4 = *(uint *)&this->field_0x8 & 0x1ffffff;
      goto LAB_0014c5c4;
    }
    PVar2 = (PrgNode)(this + 1);
  }
  uVar4 = *(uint *)PVar2;
LAB_0014c5c4:
  if (uVar4 == 0) {
    assignValue(this,'\x01');
    this->field_0xb = this->field_0xb | 0x20;
  }
  return this;
}

Assistant:

PrgBody* PrgBody::create(LogicProgram& prg, uint32 id, const Rule& r, uint32 pos, bool addDeps) {
	static_assert(sizeof(PrgBody) == 24 && sizeof(Agg) == sizeof(void*), "unexpected alignment");
	PrgBody* ret = 0;
	if (r.normal()) {
		size_t bytes = sizeof(PrgBody) + (Potassco::size(r.cond) * sizeof(Literal));
		ret = new (::operator new(bytes)) PrgBody(id, prg, r.cond, pos, addDeps);
	}
	else {
		const Potassco::Sum_t& sum = r.agg;
		size_t bytes = sizeof(PrgBody) + (Potassco::size(r.agg.lits) * sizeof(Literal)) + sizeof(Agg);
		ret = new (::operator new(bytes)) PrgBody(id, prg, sum, r.bt == Body_t::Sum, pos, addDeps);
		POTASSCO_REQUIRE(ret->bound() > 0 && ret->sumW() > ret->bound(), "body not simplified");
	}
	if (ret->bound() == 0) {
		ret->assignValue(value_true);
		ret->markDirty();
	}
	return ret;
}